

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O0

void set_title(char *title)

{
  int iVar1;
  char local_218 [4];
  int err;
  char buffer [512];
  char *title_local;
  
  iVar1 = uv_get_process_title(local_218,0x200);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title.c"
            ,0x20,"err == 0");
    abort();
  }
  iVar1 = uv_set_process_title(title);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title.c"
            ,0x23,"err == 0");
    abort();
  }
  iVar1 = uv_get_process_title(local_218,0x200);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title.c"
            ,0x26,"err == 0");
    abort();
  }
  iVar1 = strcmp(local_218,title);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title.c"
            ,0x28,"strcmp(buffer, title) == 0");
    abort();
  }
  return;
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  err = uv_set_process_title(title);
  ASSERT(err == 0);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  ASSERT(strcmp(buffer, title) == 0);
}